

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::predict_or_learn_cover<true>(cb_explore *data,single_learner *base,example *ec)

{
  label *this;
  label *ld;
  float fVar1;
  float fVar2;
  ulong uVar3;
  float *pfVar4;
  label_t lVar5;
  wclass *pwVar6;
  long lVar7;
  cb_class *pcVar8;
  uint uVar9;
  uint32_t uVar10;
  wclass *pwVar11;
  size_t sVar12;
  ulong uVar13;
  uint32_t i;
  ulong uVar14;
  size_t i_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined4 in_XMM2_Db;
  float fVar22;
  float fVar23;
  float local_98;
  wclass local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  action_scores probs;
  undefined1 auVar18 [16];
  
  uVar9 = (data->cbcs).num_actions;
  uVar13 = (ulong)uVar9;
  probs._begin = (ec->pred).a_s._begin;
  probs._end = (ec->pred).a_s._end;
  probs.end_array = (ec->pred).a_s.end_array;
  probs.erase_count = (ec->pred).scalars.erase_count;
  pwVar11 = (wclass *)base;
  v_array<ACTION_SCORE::action_score>::clear(&probs);
  this = &data->cs_label;
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  for (uVar10 = 1; uVar10 - uVar9 != 1; uVar10 = uVar10 + 1) {
    local_78.x = 3.4028235e+38;
    local_78.partial_prediction = 0.0;
    local_78.wap_value = 0.0;
    pwVar11 = &local_78;
    local_78.class_index = uVar10;
    v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_78);
  }
  uVar3 = data->cover_size;
  lVar7 = data->counter * uVar13;
  auVar20._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar20._0_8_ = lVar7;
  auVar20._12_4_ = 0x45300000;
  auVar15._8_8_ = auVar20._8_8_ - 1.9342813113834067e+25;
  auVar15._0_8_ =
       SQRT(auVar15._8_8_ + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
  auVar16._4_12_ = auVar15._4_12_;
  auVar16._0_4_ = (float)auVar15._0_8_;
  auVar18._0_8_ = auVar16._0_8_;
  auVar18._8_4_ = (int)((ulong)auVar15._0_8_ >> 0x20);
  auVar18._12_4_ = in_XMM2_Db;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._4_4_ = (float)uVar13;
  auVar17._0_4_ = auVar16._0_4_;
  auVar20 = divps(_DAT_0023ac40,auVar17);
  local_68 = auVar20._4_4_;
  ld = &data->cb_label;
  lVar5 = (ec->l).multi;
  pcVar8 = (cb_class *)(ec->l).cs.costs._end;
  sVar12 = (ec->l).cs.costs.erase_count;
  (data->cb_label).costs.end_array = (cb_class *)(ec->l).cs.costs.end_array;
  (data->cb_label).costs.erase_count = sVar12;
  (data->cb_label).costs._begin = (cb_class *)lVar5;
  (data->cb_label).costs._end = pcVar8;
  lVar5 = (label_t)(this->costs)._begin;
  pwVar6 = (data->cs_label).costs._end;
  sVar12 = (data->cs_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (data->cs_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar12;
  (ec->l).multi = lVar5;
  (ec->l).cs.costs._end = pwVar6;
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  get_cover_probabilities(data,(single_learner *)pwVar11,ec,&probs);
  lVar5 = (label_t)(data->cb_label).costs._begin;
  pcVar8 = (data->cb_label).costs._end;
  sVar12 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar12;
  (ec->l).multi = lVar5;
  (ec->l).cs.costs._end = (wclass *)pcVar8;
  LEARNER::learner<char,_example>::learn(base,ec,0);
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  lVar5 = (label_t)(data->cb_label).costs._begin;
  pcVar8 = (data->cb_label).costs._end;
  sVar12 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar12;
  (ec->l).multi = lVar5;
  (ec->l).cs.costs._end = (wclass *)pcVar8;
  pcVar8 = GEN_CS::get_observed_cost(ld);
  (data->cbcs).known_cost = pcVar8;
  GEN_CS::gen_cs_example<false>(&data->cbcs,ec,ld,this);
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    (data->cover_probs)._begin[uVar14] = 0.0;
  }
  fVar23 = 1.0 / (float)uVar3;
  local_98 = auVar20._0_4_;
  if (local_68 <= local_98) {
    local_98 = local_68;
  }
  fVar22 = (float)uVar13 * local_98;
  lVar5 = (label_t)(data->second_cs_label).costs._begin;
  pwVar11 = (data->second_cs_label).costs._end;
  sVar12 = (data->second_cs_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (data->second_cs_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar12;
  (ec->l).multi = lVar5;
  (ec->l).cs.costs._end = pwVar11;
  sVar12 = 0;
  while (sVar12 != uVar3) {
    uVar10 = 1;
    for (lVar7 = 0; uVar13 << 2 != lVar7; lVar7 = lVar7 + 4) {
      fVar1 = (&((data->cs_label).costs._begin)->x)[lVar7];
      fVar19 = data->psi;
      fVar2 = *(float *)((long)(data->cover_probs)._begin + lVar7);
      fVar21 = local_98;
      if (local_98 <= fVar2) {
        fVar21 = fVar2;
      }
      (&((data->second_cs_label).costs._begin)->class_index)[lVar7] = uVar10;
      (&((data->second_cs_label).costs._begin)->x)[lVar7] =
           (fVar1 - (fVar19 * local_98) / (fVar21 / fVar22)) + 1.0;
      uVar10 = uVar10 + 1;
    }
    i_00 = 1;
    if (sVar12 != 0) {
      i_00 = sVar12 + 1;
      LEARNER::learner<CB_EXPLORE::cb_explore,_example>::learn(data->cs,ec,i_00);
    }
    pfVar4 = (data->cover_probs)._begin;
    uVar9 = (data->preds)._begin[sVar12] - 1;
    fVar1 = pfVar4[uVar9];
    fVar19 = (fVar1 - local_98) + fVar23;
    uVar14 = (ulong)fVar19;
    fVar22 = fVar22 + (float)(~-(uint)(fVar1 < local_98) & (uint)fVar23 |
                             (uint)(float)((long)(fVar19 - 9.223372e+18) & (long)uVar14 >> 0x3f |
                                          uVar14) & -(uint)(fVar1 < local_98));
    pfVar4[uVar9] = fVar23 + fVar1;
    sVar12 = i_00;
  }
  lVar5 = (label_t)(ld->costs)._begin;
  pcVar8 = (data->cb_label).costs._end;
  sVar12 = (data->cb_label).costs.erase_count;
  (ec->l).cs.costs.end_array = (wclass *)(data->cb_label).costs.end_array;
  (ec->l).cs.costs.erase_count = sVar12;
  (ec->l).multi = lVar5;
  (ec->l).cs.costs._end = (wclass *)pcVar8;
  (ec->pred).a_s.end_array = probs.end_array;
  (ec->pred).scalars.erase_count = probs.erase_count;
  (ec->pred).a_s._begin = probs._begin;
  (ec->pred).a_s._end = probs._end;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.

  uint32_t num_actions = data.cbcs.num_actions;

  action_scores probs = ec.pred.a_s;
  probs.clear();
  data.cs_label.costs.clear();

  for (uint32_t j = 0; j < num_actions; j++) data.cs_label.costs.push_back({FLT_MAX, j + 1, 0., 0.});

  size_t cover_size = data.cover_size;
  size_t counter = data.counter;
  v_array<float>& probabilities = data.cover_probs;
  v_array<uint32_t>& predictions = data.preds;

  float additive_probability = 1.f / (float)cover_size;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(counter * num_actions));

  data.cb_label = ec.l.cb;

  ec.l.cs = data.cs_label;
  get_cover_probabilities(data, base, ec, probs);

  if (is_learn)
  {
    ec.l.cb = data.cb_label;
    base.learn(ec);

    // Now update oracles

    // 1. Compute loss vector
    data.cs_label.costs.clear();
    float norm = min_prob * num_actions;
    ec.l.cb = data.cb_label;
    data.cbcs.known_cost = get_observed_cost(data.cb_label);
    gen_cs_example<false>(data.cbcs, ec, data.cb_label, data.cs_label);
    for (uint32_t i = 0; i < num_actions; i++) probabilities[i] = 0;

    ec.l.cs = data.second_cs_label;
    // 2. Update functions
    for (size_t i = 0; i < cover_size; i++)
    {
      // Create costs of each action based on online cover
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_label.costs[j].x - data.psi * min_prob / (max(probabilities[j], min_prob) / norm) + 1;
        data.second_cs_label.costs[j].class_index = j + 1;
        data.second_cs_label.costs[j].x = pseudo_cost;
      }
      if (i != 0)
        data.cs->learn(ec, i + 1);
      if (probabilities[predictions[i] - 1] < min_prob)
        norm += max(0, additive_probability - (min_prob - probabilities[predictions[i] - 1]));
      else
        norm += additive_probability;
      probabilities[predictions[i] - 1] += additive_probability;
    }
  }

  ec.l.cb = data.cb_label;
  ec.pred.a_s = probs;
}